

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_8::DiskHandle::clone
          (DiskHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  void *pvVar2;
  Fault local_68;
  Fault f_1;
  SyscallResult local_50 [2];
  SyscallResult _kjSyscallResult;
  Fault local_40;
  Fault f;
  undefined1 auStack_30 [4];
  int error;
  DiskHandle *local_28;
  int local_20;
  undefined1 local_1c [4];
  int _kjSyscallError;
  int fd2;
  DiskHandle *this_local;
  AutoCloseFd *result;
  
  _auStack_30 = (int *)local_1c;
  local_28 = (DiskHandle *)__fn;
  __kjSyscallError = __fn;
  this_local = this;
  f.exception._4_4_ =
       _::Debug::syscallError<kj::(anonymous_namespace)::DiskHandle::clone()const::_lambda()_1_>
                 ((anon_class_16_2_20c44c61 *)auStack_30,false);
  local_20 = f.exception._4_4_;
  if (f.exception._4_4_ == 0) {
    AutoCloseFd::AutoCloseFd(&this->fd,(int)local_1c);
  }
  else {
    if ((f.exception._4_4_ != 0x16) && (f.exception._4_4_ != 0x5f)) {
      _::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x11c,f.exception._4_4_,"fnctl(fd, F_DUPFD_CLOEXEC, 3)","");
      _::Debug::Fault::~Fault(&local_40);
    }
    f_1.exception = (Exception *)local_1c;
    local_50[0] = _::Debug::
                  syscall<kj::(anonymous_namespace)::DiskHandle::clone()const::_lambda()_2_>
                            ((anon_class_16_2_20c44c61 *)&f_1,false);
    pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(local_50);
    if (pvVar2 == (void *)0x0) {
      iVar1 = _::Debug::SyscallResult::getErrorNumber(local_50);
      _::Debug::Fault::Fault
                (&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x123,iVar1,"fd2 = ::dup(fd)","");
      _::Debug::Fault::fatal(&local_68);
    }
    AutoCloseFd::AutoCloseFd(&this->fd,(int)local_1c);
    iVar1 = AutoCloseFd::operator_cast_to_int(&this->fd);
    setCloexec(iVar1);
  }
  return (int)this;
}

Assistant:

AutoCloseFd clone() const {
    int fd2;
#ifdef F_DUPFD_CLOEXEC
    KJ_SYSCALL_HANDLE_ERRORS(fd2 = fcntl(fd, F_DUPFD_CLOEXEC, 3)) {
      case EINVAL:
      case EOPNOTSUPP:
        // fall back
        break;
      default:
        KJ_FAIL_SYSCALL("fnctl(fd, F_DUPFD_CLOEXEC, 3)", error) { break; }
        break;
    } else {
      return AutoCloseFd(fd2);
    }
#endif

    KJ_SYSCALL(fd2 = ::dup(fd));
    AutoCloseFd result(fd2);
    setCloexec(result);
    return result;
  }